

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  uint uVar5;
  undefined8 uVar6;
  domain_error *this;
  istream *prefix;
  ConfigData *in_RDI;
  string line;
  ifstream f;
  string *in_stack_fffffffffffffc68;
  ConfigData *in_stack_fffffffffffffc70;
  undefined6 in_stack_fffffffffffffc78;
  allocator *in_stack_fffffffffffffc90;
  undefined6 in_stack_fffffffffffffc98;
  byte bVar7;
  byte bVar8;
  string *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffcb8;
  string local_340 [32];
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [37];
  byte local_2b3;
  byte local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [39];
  undefined1 local_249;
  string local_248 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [528];
  ConfigData *local_8;
  
  local_8 = in_RDI;
  uVar6 = std::__cxx11::string::c_str();
  __rhs = local_218;
  std::ifstream::ifstream(__rhs,uVar6,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_270);
    while( true ) {
      prefix = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_218,local_270);
      uVar2 = std::ios::operator_cast_to_bool((ios *)(prefix + *(long *)(*(long *)prefix + -0x18)));
      if (!(bool)uVar2) break;
      trim(in_stack_fffffffffffffca8);
      std::__cxx11::string::operator=(local_270,local_290);
      std::__cxx11::string::~string(local_290);
      uVar5 = std::__cxx11::string::empty();
      local_2b2 = 0;
      local_2b3 = 0;
      bVar7 = 0;
      if ((uVar5 & 1) == 0) {
        in_stack_fffffffffffffc90 = &local_2b1;
        std::allocator<char>::allocator();
        local_2b2 = 1;
        std::__cxx11::string::string(local_2b0,"#",in_stack_fffffffffffffc90);
        local_2b3 = 1;
        bVar3 = startsWith(in_stack_fffffffffffffca8,(string *)prefix);
        bVar7 = bVar3 ^ 0xff;
      }
      bVar8 = bVar7;
      if ((local_2b3 & 1) != 0) {
        std::__cxx11::string::~string(local_2b0);
      }
      if ((local_2b2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      }
      if ((bVar7 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"\"",&local_2d9);
        uVar4 = startsWith(in_stack_fffffffffffffca8,(string *)prefix);
        bVar7 = uVar4 ^ 0xff;
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        if ((bVar7 & 1) != 0) {
          std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffcb8),__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar4,CONCAT16(bVar7,in_stack_fffffffffffffc78)),
                         &in_stack_fffffffffffffc70->listTests);
          std::__cxx11::string::operator=(local_270,local_300);
          std::__cxx11::string::~string(local_300);
          std::__cxx11::string::~string(local_320);
        }
        in_stack_fffffffffffffc70 = local_8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,CONCAT16(bVar8,in_stack_fffffffffffffc98)),
                       (char *)in_stack_fffffffffffffc90);
        addTestOrTags(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        std::__cxx11::string::~string(local_340);
      }
    }
    std::__cxx11::string::~string(local_270);
    std::ifstream::~ifstream(local_218);
    return;
  }
  local_249 = 1;
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffcb8),__rhs);
  std::domain_error::domain_error(this,local_248);
  local_249 = 0;
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) ) {
                if( !startsWith( line, "\"" ) )
                    line = "\"" + line + "\"";
                addTestOrTags( config, line + "," );
            }
        }
    }